

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondZvol.cpp
# Opt level: O2

void __thiscall OpenMD::HBondZvol::process(HBondZvol *this)

{
  SelectionManager *this_00;
  SelectionManager *this_01;
  int *piVar1;
  char cVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_02;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  Molecule *this_03;
  Molecule *pMVar7;
  ulong uVar8;
  Atom *pAVar9;
  pointer ppAVar10;
  HBondDonor *pHVar11;
  pointer ppHVar12;
  RealType RVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int jj;
  int ii;
  Vector3d mPos;
  Vector3d hPos;
  Vector3d DH;
  Vector3d dPos;
  Vector3d aPos;
  Vector3d DA;
  Mat3x3d hmat;
  DumpReader reader;
  int local_13b8;
  int local_13b4;
  double local_13b0;
  double local_13a8;
  SelectionSet local_13a0;
  Vector<double,_3U> local_1388;
  ulong local_1370;
  SelectionEvaluator *local_1368;
  SelectionEvaluator *local_1360;
  vector<double,_std::allocator<double>_> *local_1358;
  pointer local_1350;
  Vector<double,_3U> local_1348;
  Vector<double,_3U> local_1330;
  Vector<double,_3U> local_1318;
  Vector<double,_3U> local_1300;
  Mat3x3d local_12e8;
  Vector<double,_3U> local_12a0;
  DumpReader local_1288;
  
  Vector<double,_3U>::Vector(&local_1330);
  Vector<double,_3U>::Vector(&local_1318);
  Vector<double,_3U>::Vector(&local_1388);
  Vector<double,_3U>::Vector(&local_1348);
  Vector<double,_3U>::Vector(&local_1300);
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar5 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  local_1358 = &this->zBox_;
  local_1360 = &this->evaluator1_;
  this_00 = &this->seleMan1_;
  local_1368 = &this->evaluator2_;
  this_01 = &this->seleMan2_;
  uVar8 = 0;
  while ((int)uVar8 < iVar5) {
    local_1370 = uVar8;
    DumpReader::readFrame(&local_1288,(int)uVar8);
    this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_02;
    Snapshot::getHmat(&local_12e8,this_02);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1358,
               (value_type_conflict2 *)
               ((long)local_12e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20));
    RVar13 = Snapshot::getVolume(this->currentSnapshot_);
    uVar3 = (this->super_StaticAnalyser).nBins_;
    local_13a8 = *(double *)
                  ((long)local_12e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_ + (ulong)(uint)this->axis_ * 0x20) * 0.5;
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_13a0,local_1360);
      SelectionManager::setSelectionSet(this_00,&local_13a0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_13a0.bitsets_);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_13a0,local_1368);
      SelectionManager::setSelectionSet(this_01,&local_13a0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_13a0.bitsets_);
    }
    this_03 = SelectionManager::beginSelectedMolecule(this_00,&local_13b4);
    local_13b0 = 1.0 / (RVar13 / (double)uVar3);
    while (this_03 != (Molecule *)0x0) {
      Molecule::getCom((Vector3d *)&local_13a0,this_03);
      pMVar7 = SelectionManager::beginSelectedMolecule(this_01,&local_13b8);
      while (pMVar7 != (Molecule *)0x0) {
        ppHVar12 = (this_03->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppHVar12 !=
            (this_03->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013e2b0;
        pHVar11 = (HBondDonor *)0x0;
        while (pHVar11 != (HBondDonor *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar11->donorAtom->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_1330,&local_12a0);
          StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar11->donatedHydrogen->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_1388,&local_12a0);
          operator-(&local_12a0,&local_1388,&local_1330);
          Vector3<double>::operator=((Vector3<double> *)&local_1348,&local_12a0);
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1348);
          dVar14 = Vector<double,_3U>::length(&local_1348);
          ppAVar10 = (pMVar7->hBondAcceptors_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (ppAVar10 !=
              (pMVar7->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_0013e28c;
          pAVar9 = (Atom *)0x0;
          while (pAVar9 != (Atom *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_12a0,&pAVar9->super_StuntDouble);
            Vector<double,_3U>::operator=(&local_1318,&local_12a0);
            operator-(&local_12a0,&local_1318,&local_1330);
            Vector3<double>::operator=((Vector3<double> *)&local_1300,&local_12a0);
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1300);
            dVar15 = Vector<double,_3U>::length(&local_1300);
            if (dVar15 < this->rCut_) {
              dVar16 = dot<double,3u>(&local_1348,&local_1300);
              dVar15 = acos(dVar16 / (dVar15 * dVar14));
              if ((dVar15 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                if (cVar2 != '\0') {
                  Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1388);
                }
                iVar6 = (int)(((local_1388.data_[(uint)this->axis_] + local_13a8) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12e8.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis_ * 0x20));
                pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar4[iVar6] = pdVar4[iVar6] + local_13b0;
                piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar6;
                *piVar1 = *piVar1 + 1;
              }
            }
            ppAVar10 = ppAVar10 + 1;
            pAVar9 = (Atom *)0x0;
            if (ppAVar10 !=
                (pMVar7->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_0013e28c:
              pAVar9 = *ppAVar10;
            }
          }
          ppHVar12 = ppHVar12 + 1;
          pHVar11 = (HBondDonor *)0x0;
          if (ppHVar12 !=
              (this_03->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013e2b0:
            pHVar11 = *ppHVar12;
          }
        }
        ppAVar10 = (this_03->hBondAcceptors_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppAVar10 ==
            (this_03->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar10;
        }
        while (pAVar9 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_12a0,&pAVar9->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_1318,&local_12a0);
          ppHVar12 = (pMVar7->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_1350 = ppAVar10;
          if (ppHVar12 !=
              (pMVar7->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013e4c9;
          pHVar11 = (HBondDonor *)0x0;
          while (pHVar11 != (HBondDonor *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar11->donorAtom->super_StuntDouble);
            Vector<double,_3U>::operator=(&local_1330,&local_12a0);
            operator-(&local_12a0,&local_1318,&local_1330);
            Vector3<double>::operator=((Vector3<double> *)&local_1300,&local_12a0);
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1300);
            dVar14 = Vector<double,_3U>::length(&local_1300);
            if (dVar14 < this->rCut_) {
              StuntDouble::getPos((Vector3d *)&local_12a0,
                                  &pHVar11->donatedHydrogen->super_StuntDouble);
              Vector<double,_3U>::operator=(&local_1388,&local_12a0);
              operator-(&local_12a0,&local_1388,&local_1330);
              Vector3<double>::operator=((Vector3<double> *)&local_1348,&local_12a0);
              Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1348);
              dVar15 = Vector<double,_3U>::length(&local_1348);
              dVar16 = dot<double,3u>(&local_1348,&local_1300);
              dVar14 = acos(dVar16 / (dVar14 * dVar15));
              if ((dVar14 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                if (cVar2 != '\0') {
                  Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1388);
                }
                iVar6 = (int)(((local_1388.data_[(uint)this->axis_] + local_13a8) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12e8.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis_ * 0x20));
                pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar4[iVar6] = pdVar4[iVar6] + local_13b0;
                piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar6;
                *piVar1 = *piVar1 + 1;
              }
            }
            ppHVar12 = ppHVar12 + 1;
            pHVar11 = (HBondDonor *)0x0;
            if (ppHVar12 !=
                (pMVar7->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013e4c9:
              pHVar11 = *ppHVar12;
            }
          }
          ppAVar10 = local_1350 + 1;
          pAVar9 = (Atom *)0x0;
          if (ppAVar10 !=
              (this_03->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar9 = *ppAVar10;
          }
        }
        pMVar7 = SelectionManager::nextSelectedMolecule(this_01,&local_13b8);
      }
      this_03 = SelectionManager::nextSelectedMolecule(this_00,&local_13b4);
    }
    uVar8 = (ulong)(uint)((int)local_1370 + (this->super_StaticAnalyser).step_);
  }
  writeDensity(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void HBondZvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;
    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;
    RealType sliceVol;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();

      RealType Lx = hmat(0, 0);
      RealType Ly = hmat(1, 1);
      RealType Lz = hmat(2, 2);

      zBox_.push_back(hmat(axis_, axis_));
      sliceVol = currentSnapshot_->getVolume() / nBins_;

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
    }
    writeDensity();
  }